

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50;
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x50 = 0x8073f8;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x38 = 0x8074c0;
  *(pointer *)
   ((long)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           ._M_impl + 8) = (pointer)(vtable + 0x40);
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.have = 0x807448;
  *(undefined8 *)&this[-1].super_IfcTypeProduct.Tag.have = 0x807470;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x807498;
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this_00,&PTR_construction_vtable_24__008074d8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}